

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void __thiscall ncnn::PoolAllocator::fastFree(PoolAllocator *this,void *ptr)

{
  Mutex *__mutex;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *this_00;
  _List_node_base *p_Var1;
  const_iterator __position;
  value_type local_30;
  
  __mutex = &this->payouts_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  this_00 = &this->payouts;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      fprintf(_stderr,"FATAL ERROR! pool allocator get wild %p\n",ptr);
      free(ptr);
      return;
    }
  } while (__position._M_node[1]._M_prev != (_List_node_base *)ptr);
  p_Var1 = __position._M_node[1]._M_next;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::erase
            (this_00,__position);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_mutex_lock((pthread_mutex_t *)&this->budgets_lock);
  local_30.first = (unsigned_long)p_Var1;
  local_30.second = ptr;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(&this->budgets,&local_30);
  pthread_mutex_unlock((pthread_mutex_t *)&this->budgets_lock);
  return;
}

Assistant:

void PoolAllocator::fastFree(void* ptr)
{
    payouts_lock.lock();

    // return to budgets
    std::list< std::pair<size_t, void*> >::iterator it = payouts.begin();
    for (; it != payouts.end(); it++)
    {
        if (it->second == ptr)
        {
            size_t size = it->first;

            payouts.erase(it);

            payouts_lock.unlock();

            budgets_lock.lock();

            budgets.push_back(std::make_pair(size, ptr));

            budgets_lock.unlock();

            return;
        }
    }

    payouts_lock.unlock();

    fprintf(stderr, "FATAL ERROR! pool allocator get wild %p\n", ptr);
    ncnn::fastFree(ptr);
}